

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::Restaurant(Restaurant *this,string *configFilePath)

{
  pointer ppTVar1;
  pointer ppTVar2;
  pointer pDVar3;
  pointer pDVar4;
  char cVar5;
  int iVar6;
  DishType d_type;
  int iVar7;
  istream *piVar8;
  long lVar9;
  Table *this_00;
  Restaurant *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newDish;
  string line;
  string token;
  string delimeter;
  Table *t;
  string local_2a0 [40];
  string local_278;
  undefined1 local_258 [32];
  ifstream myfile;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_0010fd88;
  this->open = true;
  *(undefined8 *)&this->nextCustomerId = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->newMsg,"",(allocator *)&myfile);
  std::ifstream::ifstream(&myfile,(string *)configFilePath,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&delimeter,",",(allocator *)&t);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    iVar6 = 0x7f;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&myfile,(string *)&line);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::append((char *)&line);
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      newDish.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      newDish.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      newDish.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        lVar9 = std::__cxx11::string::find((string *)&line,(ulong)&delimeter);
        if ((lVar9 == -1) || (*line._M_dataplus._M_p == '#')) break;
        ppTVar1 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppTVar2 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::__cxx11::string::substr((ulong)&t,(ulong)&line);
        std::__cxx11::string::operator=((string *)&token,(string *)&t);
        std::__cxx11::string::~string((string *)&t);
        if (iVar6 == 0x7f) {
          iVar6 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
          std::__cxx11::string::erase((ulong)&line,0);
        }
        else if ((int)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3) < iVar6) {
          this_00 = (Table *)operator_new(0x40);
          iVar7 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
          Table::Table(this_00,iVar7);
          t = this_00;
          std::vector<Table_*,_std::allocator<Table_*>_>::push_back(&this->tables,(value_type *)&t);
          std::__cxx11::string::erase((ulong)&line,0);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&newDish,&token);
          std::__cxx11::string::erase((ulong)&line,0);
        }
        if ((long)newDish.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)newDish.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          this_01 = (Restaurant *)local_258;
          std::__cxx11::string::string
                    ((string *)local_258,
                     (string *)
                     (newDish.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          d_type = findMyType(this_01,(string *)local_258);
          std::__cxx11::string::~string((string *)local_258);
          pDVar3 = (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pDVar4 = (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::__cxx11::string::string
                    ((string *)&local_278,
                     (string *)
                     newDish.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          iVar7 = std::__cxx11::stoi(newDish.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10)
          ;
          Dish::Dish((Dish *)&t,(int)(((long)pDVar3 - (long)pDVar4) / 0x30),&local_278,iVar7,d_type)
          ;
          std::__cxx11::string::~string((string *)&local_278);
          std::vector<Dish,_std::allocator<Dish>_>::push_back(&this->menu,(Dish *)&t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&newDish);
          std::__cxx11::string::~string(local_2a0);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&newDish);
      std::__cxx11::string::~string((string *)&token);
    }
  }
  std::__cxx11::string::~string((string *)&delimeter);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&myfile);
  return;
}

Assistant:

Restaurant::Restaurant(const std::string &configFilePath) : open(true), nextCustomerId(0), tables(), menu(), actionsLog(), newMsg("")
{
    std::ifstream myfile(configFilePath);
    std::string line;
    std::string delimeter = ",";
    int numOfTables = INT8_MAX;

    if(myfile.is_open())
    {
        while (getline(myfile, line))
        {
            line  += ",";
            size_t pos = 0;
            std::string token;
            std::vector<std::string> newDish;
            while ((pos = line.find(delimeter)) != std::string::npos && line[0] != '#')
            {
                int tablesSize = tables.size();

                token = line.substr(0, pos);
                if(numOfTables == INT8_MAX)
                {
                    numOfTables = std::stoi(token);
                    line.erase(0, pos + delimeter.length());
                }
                else if(tablesSize < numOfTables)
                {
                    auto *t = new Table(std::stoi(token));
                    tables.push_back(t);
                    line.erase(0, pos + delimeter.length());
                }
                else
                {

                    newDish.push_back(token);
                    line.erase(0, pos + delimeter.length());
                }
                if(newDish.size() == 3)
                {
                    DishType menuDish = findMyType(newDish[1]);
                    Dish toBeAdd(static_cast<int>(menu.size()), newDish[0], std::stoi(newDish[2]), menuDish);
                    menu.push_back(toBeAdd);
                    newDish.clear();
                }
            }
        }
    }
}